

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O1

JSValue js_typed_array_slice(JSContext *ctx,JSValue this_val,int argc,JSValue *argv)

{
  ushort uVar1;
  uint uVar2;
  JSValueUnion JVar3;
  int iVar4;
  int iVar5;
  JSObject *pJVar6;
  ulong uVar7;
  JSValueUnion JVar8;
  ulong uVar9;
  JSValue *argv_00;
  ulong uVar10;
  uint uVar11;
  JSValue this_val_00;
  JSValue this_val_01;
  JSValue this_obj;
  JSValue v;
  JSValue JVar12;
  JSValue prop;
  int final;
  int start;
  int local_94;
  ulong local_90;
  JSValueUnion local_88;
  uint local_80;
  uint local_7c;
  int64_t local_78;
  JSValueUnion local_70;
  JSValue local_68;
  JSValueUnion local_58;
  int64_t local_50;
  ulong local_48;
  undefined8 local_40;
  
  iVar4 = js_typed_array_get_length_internal(ctx,this_val);
  if (-1 < iVar4) {
    argv_00 = (JSValue *)0x0;
    local_88 = this_val.u;
    iVar5 = JS_ToInt32Clamp(ctx,(int *)&local_7c,*argv,0,iVar4,iVar4);
    if (iVar5 == 0) {
      local_94 = iVar4;
      if ((int)argv[1].tag != 3) {
        argv_00 = (JSValue *)0x0;
        JVar12.tag = argv[1].tag;
        JVar12.u.ptr = argv[1].u.ptr;
        iVar4 = JS_ToInt32Clamp(ctx,&local_94,JVar12,0,iVar4,iVar4);
        if (iVar4 != 0) goto LAB_0016f80f;
      }
      JVar3 = local_88;
      local_90 = (ulong)local_7c;
      uVar11 = local_94 - local_7c;
      uVar2 = 0;
      if (0 < (int)uVar11) {
        uVar2 = uVar11;
      }
      local_58.float64 = local_88.float64;
      if (((int)this_val.tag != -1) ||
         (JVar8 = local_88, 8 < (ushort)(*(short *)((long)local_88.ptr + 6) - 0x15U))) {
        JVar8.float64 = 0.0;
        JS_ThrowTypeError(ctx,"not a %s","TypedArray");
      }
      if (JVar8.ptr != (void *)0x0) {
        local_80 = (uint)(byte)"includes"[(ulong)*(ushort *)((long)JVar8.ptr + 6) + 1];
        local_58.float64 = JVar3.float64;
        local_40 = 0;
        this_val_00.tag = (int64_t)&local_58;
        this_val_00.u.float64 = 9.88131291682493e-324;
        local_78 = this_val.tag;
        local_50 = this_val.tag;
        local_48 = (ulong)uVar2;
        JVar12 = js_typed_array___speciesCreate(ctx,this_val_00,0x17cfea,argv_00);
        uVar10 = (ulong)JVar12.u.ptr >> 0x20;
        if ((int)JVar12.tag != 6) {
          if ((int)uVar11 < 1) {
            return JVar12;
          }
          this_val_01.tag = local_78;
          this_val_01.u.ptr = local_88.ptr;
          iVar4 = validate_typed_array(ctx,this_val_01);
          if ((iVar4 == 0) && (iVar4 = validate_typed_array(ctx,JVar12), iVar4 == 0)) {
            pJVar6 = get_typed_array(ctx,JVar12,0);
            iVar4 = (int)local_90;
            if (pJVar6 != (JSObject *)0x0) {
              uVar1 = (pJVar6->field_0).header.dummy2;
              if (((*(ushort *)((long)JVar8.ptr + 6) == uVar1) &&
                  (uVar2 <= ((pJVar6->u).typed_array)->length >>
                            ("includes"[(ulong)uVar1 + 1] & 0x1fU))) &&
                 (iVar4 + uVar2 <=
                  *(uint *)(*(long *)((long)JVar8.ptr + 0x30) + 0x24) >>
                  ("includes"[(ulong)*(ushort *)((long)JVar8.ptr + 6) + 1] & 0x1fU))) {
                memcpy((pJVar6->u).func.var_refs,
                       (void *)((long)(iVar4 << ((byte)local_80 & 0x1f)) +
                               *(long *)((long)JVar8.ptr + 0x38)),
                       (long)(int)(uVar2 << ((byte)local_80 & 0x1f)));
                return JVar12;
              }
            }
            uVar7 = 1;
            if (1 < (int)uVar11) {
              uVar7 = (ulong)uVar11;
            }
            uVar9 = 0;
            while ((this_obj.tag = local_78, this_obj.u.float64 = local_88.float64,
                   local_68 = JS_GetPropertyValue(ctx,this_obj,
                                                  (JSValue)ZEXT416((uint)(iVar4 + (int)uVar9))),
                   (int)local_68.tag != 6 &&
                   (prop.tag = 0, prop.u = (JSValueUnion)uVar9,
                   iVar5 = JS_SetPropertyValue(ctx,JVar12,prop,local_68,0x4000), -1 < iVar5))) {
              uVar9 = uVar9 + 1;
              if (uVar7 == uVar9) {
                return JVar12;
              }
            }
          }
        }
        goto LAB_0016f812;
      }
    }
  }
LAB_0016f80f:
  JVar12 = (JSValue)(ZEXT816(3) << 0x40);
  uVar10 = 0;
LAB_0016f812:
  local_70.ptr = (void *)((ulong)JVar12.u.ptr & 0xffffffff | uVar10 << 0x20);
  if ((0xfffffff4 < (uint)JVar12.tag) &&
     (iVar4 = *local_70.ptr, *(int *)local_70.ptr = iVar4 + -1, iVar4 < 2)) {
    v.tag = JVar12.tag;
    v.u.ptr = local_70.ptr;
    __JS_FreeValueRT(ctx->rt,v);
  }
  return (JSValue)(ZEXT816(6) << 0x40);
}

Assistant:

static JSValue js_typed_array_slice(JSContext *ctx, JSValueConst this_val,
                                    int argc, JSValueConst *argv)
{
    JSValueConst args[2];
    JSValue arr, val;
    JSObject *p, *p1;
    int n, len, start, final, count, shift;

    arr = JS_UNDEFINED;
    len = js_typed_array_get_length_internal(ctx, this_val);
    if (len < 0)
        goto exception;

    if (JS_ToInt32Clamp(ctx, &start, argv[0], 0, len, len))
        goto exception;
    final = len;
    if (!JS_IsUndefined(argv[1])) {
        if (JS_ToInt32Clamp(ctx, &final, argv[1], 0, len, len))
            goto exception;
    }
    count = max_int(final - start, 0);

    p = get_typed_array(ctx, this_val, 0);
    if (p == NULL)
        goto exception;
    shift = typed_array_size_log2(p->class_id);

    args[0] = this_val;
    args[1] = JS_NewInt32(ctx, count);
    arr = js_typed_array___speciesCreate(ctx, JS_UNDEFINED, 2, args);
    if (JS_IsException(arr))
        goto exception;

    if (count > 0) {
        if (validate_typed_array(ctx, this_val)
        ||  validate_typed_array(ctx, arr))
            goto exception;

        p1 = get_typed_array(ctx, arr, 0);
        if (p1 != NULL && p->class_id == p1->class_id &&
            typed_array_get_length(ctx, p1) >= count &&
            typed_array_get_length(ctx, p) >= start + count) {
            memcpy(p1->u.array.u.uint8_ptr,
                   p->u.array.u.uint8_ptr + (start << shift),
                   count << shift);
        } else {
            for (n = 0; n < count; n++) {
                val = JS_GetPropertyValue(ctx, this_val, JS_NewInt32(ctx, start + n));
                if (JS_IsException(val))
                    goto exception;
                if (JS_SetPropertyValue(ctx, arr, JS_NewInt32(ctx, n), val,
                                        JS_PROP_THROW) < 0)
                    goto exception;
            }
        }
    }
    return arr;

 exception:
    JS_FreeValue(ctx, arr);
    return JS_EXCEPTION;
}